

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleTypeHandler<6UL>::IsObjTypeSpecEquivalent
          (SimpleTypeHandler<6UL> *this,Type *type,EquivalentPropertyEntry *entry)

{
  ulong uVar1;
  ushort uVar2;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = (ulong)this->propertyCount;
  if ((long)uVar1 < 1) {
    if ((entry->slotIndex != 0xffff) || (entry->mustBeWritable != false)) {
      return false;
    }
  }
  else {
    bVar6 = (this->super_DynamicTypeHandler).inlineSlotCapacity == 0;
    uVar2 = 0;
    if (!bVar6) {
      uVar2 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
    }
    paVar3 = &this->descriptors[0].field_1;
    bVar5 = true;
    uVar4 = 1;
    do {
      if ((entry->propertyId == ((((Type *)(paVar3 + -1))->Id).ptr)->pid) &&
         ((paVar3->Attributes & 8) == 0)) {
        if ((uVar2 != entry->slotIndex) || (entry->isAuxSlot != bVar6)) goto LAB_00e55480;
        if ((paVar3->Attributes & 4) == 0) goto LAB_00e5545d;
      }
      else {
        if (entry->slotIndex != 0xffff) goto LAB_00e55480;
LAB_00e5545d:
        if (entry->mustBeWritable != false) {
LAB_00e55480:
          if (!bVar5) {
            return true;
          }
          return false;
        }
      }
      bVar5 = uVar4 < uVar1;
      paVar3 = paVar3 + 2;
      bVar7 = uVar4 != uVar1;
      uVar4 = uVar4 + 1;
    } while (bVar7);
  }
  return true;
}

Assistant:

bool SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(const Type* type, const EquivalentPropertyEntry *entry)
    {
        if (this->propertyCount > 0)
        {
            for (int i = 0; i < this->propertyCount; i++)
            {
                SimplePropertyDescriptor* descriptor = &this->descriptors[i];
                Js::PropertyId propertyId = descriptor->Id->GetPropertyId();

                if (entry->propertyId == propertyId && !(descriptor->Attributes & PropertyDeleted))
                {
                    Js::PropertyIndex relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(0));
                    if (relSlotIndex != entry->slotIndex ||
                        entry->isAuxSlot != (GetInlineSlotCapacity() == 0) ||
                        (entry->mustBeWritable && !(descriptor->Attributes & PropertyWritable)))
                    {
                        return false;
                    }
                }
                else
                {
                    if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
                    {
                        return false;
                    }
                }
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }